

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_scan.cpp
# Opt level: O1

char * ON_String::ToNumber(char *buffer,ON__UINT64 value_on_failure,ON__UINT64 *value)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  bool bVar4;
  
  if (value == (ON__UINT64 *)0x0) {
    return (char *)0x0;
  }
  if (buffer != (char *)0x0) {
    if ((byte)(buffer[*buffer == '+'] - 0x30U) < 10) {
      uVar3 = (ulong)(byte)(buffer[*buffer == '+'] - 0x30U);
      pcVar2 = buffer + (*buffer == '+');
      do {
        pcVar2 = pcVar2 + 1;
        if (9 < (byte)(*pcVar2 - 0x30U)) goto LAB_005c915b;
        uVar1 = (ulong)(byte)(*pcVar2 - 0x30U) + uVar3 * 10;
        bVar4 = uVar3 <= uVar1;
        if (uVar3 < uVar1) {
          uVar3 = uVar1;
        }
      } while (bVar4);
    }
  }
  pcVar2 = (char *)0x0;
  uVar3 = value_on_failure;
LAB_005c915b:
  *value = uVar3;
  return pcVar2;
}

Assistant:

const char* ON_String::ToNumber(
  const char* buffer,
  ON__UINT64 value_on_failure,
  ON__UINT64* value
  )
{
  if (nullptr == value)
    return nullptr;

  ON__UINT64 u = value_on_failure;
  const char* rc = nullptr;

  if (nullptr != buffer)
  {
    if ('+' == buffer[0])
      buffer++;
    if (buffer[0] >= '0' && buffer[0] <= '9')
    {
      ON__UINT64 r = (ON__UINT64)(*buffer++ - '0');
      for (const char* s = buffer;/*empty test*/; s++)
      {
        if (*s >= '0' && *s <= '9')
        {
          ON__UINT64 d = ON__UINT64(*s - '0');
          ON__UINT64 r1 = r * 10LLU + d;
          if (r1 < r)
          {
            // overflow
            break;
          }
          r = r1;
          continue;
        }
        u = r;
        rc = s;
        break;
      }
    }
  }

  *value = u;
  return rc;
}